

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O0

_Bool redundant_monster_message(monster *mon,wchar_t msg_code)

{
  wchar_t local_20;
  wchar_t i;
  wchar_t msg_code_local;
  monster *mon_local;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-msg.c"
                  ,0x96,"_Bool redundant_monster_message(struct monster *, int)");
  }
  if (L'\xffffffff' < msg_code) {
    if (L'@' < msg_code) {
      __assert_fail("msg_code < MON_MSG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-msg.c"
                    ,0x98,"_Bool redundant_monster_message(struct monster *, int)");
    }
    local_20 = L'\0';
    while( true ) {
      if (size_mon_hist <= local_20) {
        return false;
      }
      if ((mon == mon_message_hist[local_20].mon) &&
         (msg_code == mon_message_hist[local_20].message_code)) break;
      local_20 = local_20 + L'\x01';
    }
    return true;
  }
  __assert_fail("msg_code >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-msg.c"
                ,0x97,"_Bool redundant_monster_message(struct monster *, int)");
}

Assistant:

static bool redundant_monster_message(struct monster *mon, int msg_code)
{
	assert(mon);
	assert(msg_code >= 0);
	assert(msg_code < MON_MSG_MAX);

	for (int i = 0; i < size_mon_hist; i++) {
		/* Check for a matched monster & monster code */
		if (mon == mon_message_hist[i].mon &&
				msg_code == mon_message_hist[i].message_code) {
			return true;
		}
	}

	return false;
}